

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O2

GregorianCalendar * __thiscall
GregorianCalendar::NthXday
          (GregorianCalendar *__return_storage_ptr__,GregorianCalendar *this,int n,int x,int month,
          int year,int day)

{
  int iVar1;
  GregorianCalendar local_40;
  
  local_40.super_Calendar.year = year;
  local_40.super_Calendar.month = month;
  if (n < 1) {
    if (day == 0) {
      day = LastMonthDay(month,year);
    }
    local_40.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
    local_40.super_Calendar.day = day;
    iVar1 = operator_cast_to_int(&local_40);
    iVar1 = General::XdayOnOrBefore(iVar1,x);
    iVar1 = n * 7 + iVar1 + 7;
  }
  else {
    local_40.super_Calendar.day = day + (uint)(day == 0);
    local_40.super_Calendar._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_0016b9d8;
    iVar1 = operator_cast_to_int(&local_40);
    iVar1 = General::XdayOnOrBefore(iVar1 + 6,x);
    iVar1 = n * 7 + iVar1 + -7;
  }
  GregorianCalendar(__return_storage_ptr__,iVar1);
  return __return_storage_ptr__;
}

Assistant:

GregorianCalendar GregorianCalendar::NthXday(int n, int x, int month, int year, int day) {
    if (n > 0) {
        if (day == 0) {
            day = 1;
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
       
        return
                GregorianCalendar
                        ((7 * (n - 1)) + General::XdayOnOrBefore(6 + calendar, x));
    }
    else {
        if (day == 0) {
            day = LastMonthDay(month, year);
        }
        GregorianCalendar calendar =
                GregorianCalendar(month, day, year);
        int date = (7 * (n + 1)) +
                General::XdayOnOrBefore(calendar, x);
        return GregorianCalendar(date);
    }
}